

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStreamPrivate::ungetChar(QTextStreamPrivate *this,QChar ch)

{
  long lVar1;
  QChar *pQVar2;
  char16_t in_SI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffd8;
  QChar c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  c.ucs = (char16_t)((ulong)in_RDI >> 0x30);
  if (in_RDI[1].d.ptr == (char16_t *)0x0) {
    if (in_RDI[0xb].d.ptr == (char16_t *)0x0) {
      QString::prepend(in_RDI,c);
    }
    else {
      in_RDI[0xb].d.ptr = (char16_t *)((long)in_RDI[0xb].d.ptr + -1);
      pQVar2 = QString::operator[](in_stack_ffffffffffffffd8,0x4aec5a);
      pQVar2->ucs = in_SI;
    }
  }
  else if (in_RDI[1].d.size == 0) {
    QString::prepend(in_RDI,c);
  }
  else {
    in_RDI[1].d.size = in_RDI[1].d.size + -1;
    pQVar2 = QString::operator[](in_stack_ffffffffffffffd8,0x4aebf9);
    pQVar2->ucs = in_SI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QTextStreamPrivate::ungetChar(QChar ch)
{
    if (string) {
        if (stringOffset == 0)
            string->prepend(ch);
        else
            (*string)[--stringOffset] = ch;
        return;
    }

    if (readBufferOffset == 0) {
        readBuffer.prepend(ch);
        return;
    }

    readBuffer[--readBufferOffset] = ch;
}